

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_linal_kalman_predict_U_diag(double *x,double *S,double *U,double *q2,size_t n,size_t m)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  long local_68;
  
  fsnav_linal_u_mul(x,U,x,n,1);
  lVar1 = n * 2 + 1;
  lVar9 = n - 2;
  lVar5 = 0;
  local_68 = 0;
  lVar2 = n * 2;
  lVar10 = 0;
  for (uVar7 = 0; uVar7 != n; uVar7 = uVar7 + 1) {
    lVar11 = lVar10 + n + local_68;
    uVar4 = uVar7;
    for (; lVar10 != lVar11; lVar10 = lVar10 + 1) {
      dVar13 = U[(lVar1 - uVar7) * uVar7 >> 1] * S[lVar10];
      S[lVar10] = dVar13;
      uVar8 = lVar10 + ~uVar7 + n;
      lVar6 = lVar9;
      pdVar12 = (double *)((long)U + lVar5 * 4 + 8);
      while ((lVar6 != -1 && (uVar8 <= (lVar1 - uVar4) * uVar4 >> 1))) {
        dVar13 = dVar13 + S[uVar8] * *pdVar12;
        S[lVar10] = dVar13;
        pdVar12 = pdVar12 + 1;
        uVar8 = uVar8 + lVar6;
        lVar6 = lVar6 + -1;
      }
      uVar4 = uVar4 + 1;
    }
    local_68 = local_68 + -1;
    lVar5 = lVar5 + lVar2;
    lVar2 = lVar2 + -2;
    lVar9 = lVar9 + -1;
    lVar10 = lVar11;
  }
  fsnav_linal_uuT(S,S,n);
  lVar9 = n * 2 + 1;
  for (sVar3 = 0; m != sVar3; sVar3 = sVar3 + 1) {
    uVar7 = lVar9 * sVar3 & 0xfffffffffffffffe;
    *(double *)((long)S + uVar7 * 4) = q2[sVar3] + *(double *)((long)S + uVar7 * 4);
    lVar9 = lVar9 + -1;
  }
  fsnav_linal_chol(S,S,n);
  return;
}

Assistant:

void fsnav_linal_kalman_predict_U_diag(double* x, double* S, double* U, double* q2, const size_t n, const size_t m)
{
	size_t i, j, j1, k0, k1, k2, k, k10, j10;

	fsnav_linal_u_mul(x, U, x, n, 1);    // x = F*x  	
	for (i = 0, k0 = 0; i < n; i++) {
		k10 = i*(2*n-i+1)/2;            // start from the diagonal in U
		j10 = n-i-1;
		for (j = i; j < n; j++, k0++) {
			k1 = k10;
			S[k0] *= U[k1];             // S = F*S
			k2 = j*(2*n-j+1)/2;         // finish at the diagonal in S
			for (j1 = j10, k1++, k = k0+j1; j1 > 0 && k <= k2; j1--, k1++, k += j1)
				S[k0] += S[k]*U[k1];
		}
	}
	fsnav_linal_uuT(S, S, n);            // P = S*S^T
	for (i = 0; i < m; i++)
		S[i*(2*n-i+1)/2] += q2[i];      // P = P + Q, Q = [diag(q2) 0; 0 0]
	fsnav_linal_chol(S, S, n);           // P = S*S^T
}